

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

void glcts::fillImage<int,4u>
               (GLsizei image_width,GLsizei image_height,int *pixel_components,int *out_data)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  GLsizei x;
  ulong uVar5;
  GLuint component;
  long lVar6;
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < image_width) {
    uVar2 = (ulong)(uint)image_width;
  }
  if (image_height < 1) {
    image_height = 0;
  }
  for (iVar3 = 0; iVar3 != image_height; iVar3 = iVar3 + 1) {
    uVar4 = uVar1;
    for (uVar5 = 0; uVar5 != uVar2; uVar5 = uVar5 + 1) {
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        out_data[(ulong)uVar4 + lVar6] = pixel_components[lVar6];
      }
      uVar4 = uVar4 + 4;
    }
    uVar1 = uVar1 + image_width * 4;
  }
  return;
}

Assistant:

void fillImage(glw::GLsizei image_width, glw::GLsizei image_height, const T* pixel_components, T* out_data)
{
	const glw::GLuint n_components_per_pixel = N_Components;
	const glw::GLuint n_components_per_line  = n_components_per_pixel * image_width;

	for (glw::GLsizei y = 0; y < image_height; ++y)
	{
		const glw::GLuint line_offset = y * n_components_per_line;

		for (glw::GLsizei x = 0; x < image_width; ++x)
		{
			for (glw::GLuint component = 0; component < n_components_per_pixel; ++component)
			{
				out_data[line_offset + x * n_components_per_pixel + component] = pixel_components[component];
			}
		}
	}
}